

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_partial_union.cpp
# Opt level: O2

void __thiscall
PartialUnion_create_adjacency_lists_Test::TestBody(PartialUnion_create_adjacency_lists_Test *this)

{
  int snapshots;
  long lVar1;
  int *piVar2;
  array<int,_8UL> *paVar3;
  char *pcVar4;
  byte bVar5;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  initializer_list<std::vector<int,_std::allocator<int>_>_> __l_01;
  initializer_list<std::array<int,_8UL>_> __l_02;
  initializer_list<std::array<int,_8UL>_> __l_03;
  initializer_list<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>
  __l_04;
  initializer_list<int> __l_05;
  initializer_list<int> __l_06;
  initializer_list<int> __l_07;
  initializer_list<int> __l_08;
  initializer_list<std::vector<int,_std::allocator<int>_>_> __l_09;
  initializer_list<std::array<int,_8UL>_> __l_10;
  initializer_list<std::array<int,_8UL>_> __l_11;
  initializer_list<std::array<int,_8UL>_> __l_12;
  initializer_list<std::array<int,_8UL>_> __l_13;
  initializer_list<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>
  __l_14;
  initializer_list<int> __l_15;
  initializer_list<int> __l_16;
  initializer_list<int> __l_17;
  initializer_list<int> __l_18;
  initializer_list<int> __l_19;
  initializer_list<std::vector<int,_std::allocator<int>_>_> __l_20;
  initializer_list<std::array<int,_8UL>_> __l_21;
  initializer_list<std::array<int,_8UL>_> __l_22;
  initializer_list<std::array<int,_8UL>_> __l_23;
  initializer_list<std::array<int,_8UL>_> __l_24;
  initializer_list<std::array<int,_8UL>_> __l_25;
  initializer_list<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>
  __l_26;
  initializer_list<int> __l_27;
  initializer_list<int> __l_28;
  initializer_list<int> __l_29;
  initializer_list<int> __l_30;
  initializer_list<std::vector<int,_std::allocator<int>_>_> __l_31;
  initializer_list<std::array<int,_8UL>_> __l_32;
  initializer_list<std::array<int,_8UL>_> __l_33;
  initializer_list<std::array<int,_8UL>_> __l_34;
  initializer_list<std::array<int,_8UL>_> __l_35;
  initializer_list<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>
  __l_36;
  initializer_list<int> __l_37;
  initializer_list<int> __l_38;
  initializer_list<int> __l_39;
  initializer_list<int> __l_40;
  initializer_list<std::vector<int,_std::allocator<int>_>_> __l_41;
  initializer_list<std::array<int,_8UL>_> __l_42;
  initializer_list<std::array<int,_8UL>_> __l_43;
  initializer_list<std::array<int,_8UL>_> __l_44;
  initializer_list<std::array<int,_8UL>_> __l_45;
  initializer_list<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>
  __l_46;
  allocator_type local_616;
  allocator_type local_615;
  allocator_type local_614;
  allocator_type local_613;
  allocator_type local_612;
  FileReader fr;
  vector<dgrminer::AdjacencyListCrate,_std::allocator<dgrminer::AdjacencyListCrate>_>
  adjacency_lists;
  array<int,_8UL> local_5f8;
  undefined8 local_5d8;
  undefined8 uStack_5d0;
  undefined8 local_5c8;
  undefined8 uStack_5c0;
  array<int,_8UL> local_598;
  undefined8 local_578;
  undefined8 uStack_570;
  undefined8 local_568;
  undefined8 uStack_560;
  vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
  adjacency_info_05_ground_truth;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  adjacency_list_05_ground_truth;
  vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
  adjacency_info_04_ground_truth;
  AssertionResult gtest_ar;
  vector<int,_std::allocator<int>_> local_4d8;
  vector<int,_std::allocator<int>_> local_4c0;
  vector<int,_std::allocator<int>_> vStack_4a8;
  vector<int,_std::allocator<int>_> local_490 [11];
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  adjacency_list_04_ground_truth;
  vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
  adjacency_info_03_ground_truth;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  adjacency_list_03_ground_truth;
  vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
  adjacency_info_02_ground_truth;
  vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> newedges;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  adjacency_list_02_ground_truth;
  vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
  adjacency_info_01_ground_truth;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  adjacency_list_01_ground_truth;
  array<int,_8UL> local_2b8;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined8 local_288;
  undefined8 uStack_280;
  array<int,_8UL> local_278;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  undefined8 uStack_240;
  string local_230;
  string input_file;
  set<dgrminer::labeled_edge_with_occurrences,_std::less<dgrminer::labeled_edge_with_occurrences>,_std::allocator<dgrminer::labeled_edge_with_occurrences>_>
  edges_set;
  set<dgrminer::labeled_node_time,_std::less<dgrminer::labeled_node_time>,_std::allocator<dgrminer::labeled_node_time>_>
  labeled_nodes;
  PartialUnion pu;
  
  bVar5 = 0;
  dgrminer::PartialUnion::PartialUnion(&pu);
  std::__cxx11::string::string((string *)&input_file,"data/intro_example",(allocator *)&gtest_ar);
  std::__cxx11::string::string((string *)&local_230,(string *)&input_file);
  dgrminer::FileReader::read_dynamic_graph_from_file
            ((PartialUnion *)&gtest_ar,&fr,&local_230,10,false);
  dgrminer::PartialUnion::operator=(&pu,(PartialUnion *)&gtest_ar);
  dgrminer::PartialUnion::~PartialUnion((PartialUnion *)&gtest_ar);
  std::__cxx11::string::~string((string *)&local_230);
  dgrminer::PartialUnion::compute_labeled_nodes(&labeled_nodes,&pu);
  snapshots = dgrminer::PartialUnion::getNumberOfSnapshots(&pu);
  newedges.super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  newedges.super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  newedges.super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  edges_set._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &edges_set._M_t._M_impl.super__Rb_tree_header._M_header;
  edges_set._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  edges_set._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  edges_set._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  edges_set._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       edges_set._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  dgrminer::PartialUnion::compute_labeled_edges(&pu,&newedges,&edges_set,&labeled_nodes,false);
  dgrminer::PartialUnion::createAdjacencyLists(&adjacency_lists,&pu,&newedges,snapshots);
  local_598._M_elems[0] = 1;
  __l._M_len = 1;
  __l._M_array = local_598._M_elems;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&gtest_ar,__l,(allocator_type *)&local_278);
  local_5f8._M_elems._0_8_ = (ulong)(uint)local_5f8._M_elems[1] << 0x20;
  __l_00._M_len = 1;
  __l_00._M_array = local_5f8._M_elems;
  std::vector<int,_std::allocator<int>_>::vector(&local_4d8,__l_00,(allocator_type *)&local_2b8);
  vStack_4a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  vStack_4a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_4c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  vStack_4a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_4c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_4c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  __l_01._M_len = 4;
  __l_01._M_array = (iterator)&gtest_ar;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(&adjacency_list_01_ground_truth,__l_01,(allocator_type *)&adjacency_list_04_ground_truth)
  ;
  lVar1 = 0x48;
  do {
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)(&gtest_ar.success_ + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  local_598._M_elems[4] = 0;
  local_598._M_elems[5] = 4;
  local_598._M_elems[6] = 0;
  local_598._M_elems[7] = 1;
  local_598._M_elems[0] = 2;
  local_598._M_elems[1] = 0;
  local_598._M_elems[2] = 1;
  local_598._M_elems[3] = 6;
  __l_02._M_len = 1;
  __l_02._M_array = &local_598;
  std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::vector
            ((vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *)&gtest_ar,
             __l_02,(allocator_type *)&local_278);
  local_5f8._M_elems[4] = 0;
  local_5f8._M_elems[5] = 2;
  local_5f8._M_elems[6] = 0;
  local_5f8._M_elems[7] = 1;
  local_5f8._M_elems[0] = 4;
  local_5f8._M_elems[1] = 0;
  local_5f8._M_elems[2] = 2;
  local_5f8._M_elems[3] = 6;
  __l_03._M_len = 1;
  __l_03._M_array = &local_5f8;
  std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::vector
            ((vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *)&local_4d8,
             __l_03,(allocator_type *)&local_2b8);
  vStack_4a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  vStack_4a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_4c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  vStack_4a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_4c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_4c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  __l_04._M_len = 4;
  __l_04._M_array = (iterator)&gtest_ar;
  std::
  vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
  ::vector(&adjacency_info_01_ground_truth,__l_04,(allocator_type *)&adjacency_list_04_ground_truth)
  ;
  lVar1 = 0x48;
  do {
    std::_Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::~_Vector_base
              ((_Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *)
               (&gtest_ar.success_ + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  local_5f8._M_elems[0] = 1;
  __l_05._M_len = 1;
  __l_05._M_array = local_5f8._M_elems;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&gtest_ar,__l_05,
             (allocator_type *)&adjacency_list_04_ground_truth);
  local_598._M_elems[0] = 0;
  local_598._M_elems[1] = 2;
  local_598._M_elems[2] = 3;
  __l_06._M_len = 3;
  __l_06._M_array = local_598._M_elems;
  std::vector<int,_std::allocator<int>_>::vector
            (&local_4d8,__l_06,(allocator_type *)&adjacency_info_02_ground_truth);
  local_278._M_elems[0] = 1;
  __l_07._M_len = 1;
  __l_07._M_array = local_278._M_elems;
  std::vector<int,_std::allocator<int>_>::vector
            (&local_4c0,__l_07,(allocator_type *)&adjacency_list_03_ground_truth);
  local_2b8._M_elems[0] = 1;
  __l_08._M_len = 1;
  __l_08._M_array = local_2b8._M_elems;
  std::vector<int,_std::allocator<int>_>::vector
            (&vStack_4a8,__l_08,(allocator_type *)&adjacency_info_03_ground_truth);
  __l_09._M_len = 4;
  __l_09._M_array = (iterator)&gtest_ar;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(&adjacency_list_02_ground_truth,__l_09,(allocator_type *)&adjacency_info_04_ground_truth)
  ;
  lVar1 = 0x48;
  do {
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)(&gtest_ar.success_ + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  local_5f8._M_elems[4] = 1;
  local_5f8._M_elems[5] = 3;
  local_5f8._M_elems[6] = -1;
  local_5f8._M_elems[7] = 1;
  local_5f8._M_elems[0] = 8;
  local_5f8._M_elems[1] = 1;
  local_5f8._M_elems[2] = 1;
  local_5f8._M_elems[3] = 0xb;
  __l_10._M_len = 1;
  __l_10._M_array = &local_5f8;
  std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::vector
            ((vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *)&gtest_ar,
             __l_10,(allocator_type *)&adjacency_list_04_ground_truth);
  piVar2 = &DAT_00153788;
  paVar3 = &local_598;
  for (lVar1 = 0x18; lVar1 != 0; lVar1 = lVar1 + -1) {
    paVar3->_M_elems[0] = *piVar2;
    piVar2 = piVar2 + (ulong)bVar5 * -2 + 1;
    paVar3 = (array<int,_8UL> *)((long)paVar3 + ((ulong)bVar5 * -2 + 1) * 4);
  }
  __l_11._M_len = 3;
  __l_11._M_array = &local_598;
  std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::vector
            ((vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *)&local_4d8,
             __l_11,(allocator_type *)&adjacency_list_03_ground_truth);
  local_278._M_elems[4] = 0;
  local_278._M_elems[5] = 3;
  local_278._M_elems[6] = -1;
  local_278._M_elems[7] = 2;
  local_278._M_elems[0] = 10;
  local_278._M_elems[1] = 1;
  local_278._M_elems[2] = 2;
  local_278._M_elems[3] = 6;
  __l_12._M_len = 1;
  __l_12._M_array = &local_278;
  std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::vector
            ((vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *)&local_4c0,
             __l_12,(allocator_type *)&adjacency_info_03_ground_truth);
  local_2b8._M_elems[4] = 0;
  local_2b8._M_elems[5] = 3;
  local_2b8._M_elems[6] = -1;
  local_2b8._M_elems[7] = 3;
  local_2b8._M_elems[0] = 10;
  local_2b8._M_elems[1] = 1;
  local_2b8._M_elems[2] = 2;
  local_2b8._M_elems[3] = 6;
  __l_13._M_len = 1;
  __l_13._M_array = &local_2b8;
  std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::vector
            ((vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *)&vStack_4a8,
             __l_13,(allocator_type *)&adjacency_info_04_ground_truth);
  __l_14._M_len = 4;
  __l_14._M_array = (iterator)&gtest_ar;
  std::
  vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
  ::vector(&adjacency_info_02_ground_truth,__l_14,(allocator_type *)&adjacency_list_05_ground_truth)
  ;
  lVar1 = 0x48;
  do {
    std::_Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::~_Vector_base
              ((_Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *)
               (&gtest_ar.success_ + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  local_598._M_elems[0] = 2;
  local_598._M_elems[1] = 3;
  local_598._M_elems[2] = 4;
  __l_15._M_len = 3;
  __l_15._M_array = local_598._M_elems;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&gtest_ar,__l_15,
             (allocator_type *)&adjacency_info_03_ground_truth);
  local_5f8._M_elems[0] = 2;
  local_5f8._M_elems[1] = 3;
  __l_16._M_len = 2;
  __l_16._M_array = local_5f8._M_elems;
  std::vector<int,_std::allocator<int>_>::vector
            (&local_4d8,__l_16,(allocator_type *)&adjacency_info_04_ground_truth);
  local_278._M_elems[0] = 1;
  local_278._M_elems[1] = 0;
  __l_17._M_len = 2;
  __l_17._M_array = local_278._M_elems;
  std::vector<int,_std::allocator<int>_>::vector
            (&local_4c0,__l_17,(allocator_type *)&adjacency_list_05_ground_truth);
  local_2b8._M_elems[0] = 1;
  local_2b8._M_elems[1] = 0;
  __l_18._M_len = 2;
  __l_18._M_array = local_2b8._M_elems;
  std::vector<int,_std::allocator<int>_>::vector
            (&vStack_4a8,__l_18,(allocator_type *)&adjacency_info_05_ground_truth);
  adjacency_list_04_ground_truth.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)((ulong)adjacency_list_04_ground_truth.
                        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start._4_4_ << 0x20);
  __l_19._M_len = 1;
  __l_19._M_array = (iterator)&adjacency_list_04_ground_truth;
  std::vector<int,_std::allocator<int>_>::vector(local_490,__l_19,&local_615);
  __l_20._M_len = 5;
  __l_20._M_array = (iterator)&gtest_ar;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(&adjacency_list_03_ground_truth,__l_20,&local_616);
  lVar1 = 0x60;
  do {
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)(&gtest_ar.success_ + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  piVar2 = &DAT_001537e8;
  paVar3 = &local_598;
  for (lVar1 = 0x18; lVar1 != 0; lVar1 = lVar1 + -1) {
    paVar3->_M_elems[0] = *piVar2;
    piVar2 = piVar2 + (ulong)bVar5 * -2 + 1;
    paVar3 = (array<int,_8UL> *)((long)paVar3 + ((ulong)bVar5 * -2 + 1) * 4);
  }
  __l_21._M_len = 3;
  __l_21._M_array = &local_598;
  std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::vector
            ((vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *)&gtest_ar,
             __l_21,(allocator_type *)&adjacency_info_04_ground_truth);
  local_5c8 = 0xd00000001;
  uStack_5c0 = 0x300000001;
  local_5d8 = 0xfffffffe00000003;
  uStack_5d0 = 0xb00000001;
  local_5f8._M_elems[4] = 1;
  local_5f8._M_elems[5] = 0xd;
  local_5f8._M_elems[6] = 1;
  local_5f8._M_elems[7] = 2;
  local_5f8._M_elems[0] = 3;
  local_5f8._M_elems[1] = -2;
  local_5f8._M_elems[2] = 1;
  local_5f8._M_elems[3] = 0xb;
  __l_22._M_len = 2;
  __l_22._M_array = &local_5f8;
  std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::vector
            ((vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *)&local_4d8,
             __l_22,(allocator_type *)&adjacency_list_05_ground_truth);
  local_248 = 0xc00000000;
  uStack_240 = 0x400000001;
  local_258 = 0x10000000d;
  uStack_250 = 0x600000001;
  local_278._M_elems[4] = 1;
  local_278._M_elems[5] = 3;
  local_278._M_elems[6] = -2;
  local_278._M_elems[7] = 2;
  local_278._M_elems[0] = 0xd;
  local_278._M_elems[1] = 1;
  local_278._M_elems[2] = 2;
  local_278._M_elems[3] = 0xb;
  __l_23._M_len = 2;
  __l_23._M_array = &local_278;
  std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::vector
            ((vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *)&local_4c0,
             __l_23,(allocator_type *)&adjacency_info_05_ground_truth);
  local_288 = 0xc00000000;
  uStack_280 = 0x500000001;
  local_298 = 0x10000000d;
  uStack_290 = 0x600000001;
  local_2b8._M_elems[4] = 1;
  local_2b8._M_elems[5] = 3;
  local_2b8._M_elems[6] = -2;
  local_2b8._M_elems[7] = 3;
  local_2b8._M_elems[0] = 0xd;
  local_2b8._M_elems[1] = 1;
  local_2b8._M_elems[2] = 2;
  local_2b8._M_elems[3] = 0xb;
  __l_24._M_len = 2;
  __l_24._M_array = &local_2b8;
  std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::vector
            ((vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *)&vStack_4a8,
             __l_24,(allocator_type *)&local_615);
  adjacency_list_04_ground_truth.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0xc00000000;
  adjacency_list_04_ground_truth.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x4;
  adjacency_list_04_ground_truth.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x600000002;
  __l_25._M_len = 1;
  __l_25._M_array = (iterator)&adjacency_list_04_ground_truth;
  std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::vector
            ((vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *)local_490,
             __l_25,(allocator_type *)&local_616);
  __l_26._M_len = 5;
  __l_26._M_array = (iterator)&gtest_ar;
  std::
  vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
  ::vector(&adjacency_info_03_ground_truth,__l_26,&local_614);
  lVar1 = 0x60;
  do {
    std::_Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::~_Vector_base
              ((_Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *)
               (&gtest_ar.success_ + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  local_598._M_elems[0] = 2;
  local_598._M_elems[1] = 3;
  local_598._M_elems[2] = 4;
  __l_27._M_len = 3;
  __l_27._M_array = local_598._M_elems;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&gtest_ar,__l_27,
             (allocator_type *)&adjacency_info_04_ground_truth);
  local_4d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_4d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_4d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_278._M_elems[0] = 0;
  local_278._M_elems[1] = 4;
  __l_28._M_len = 2;
  __l_28._M_array = local_278._M_elems;
  std::vector<int,_std::allocator<int>_>::vector
            (&local_4c0,__l_28,(allocator_type *)&adjacency_list_05_ground_truth);
  local_2b8._M_elems[0] = 0;
  local_2b8._M_elems[1] = 4;
  __l_29._M_len = 2;
  __l_29._M_array = local_2b8._M_elems;
  std::vector<int,_std::allocator<int>_>::vector
            (&vStack_4a8,__l_29,(allocator_type *)&adjacency_info_05_ground_truth);
  local_5f8._M_elems[0] = 0;
  local_5f8._M_elems[1] = 2;
  local_5f8._M_elems[2] = 3;
  __l_30._M_len = 3;
  __l_30._M_array = local_5f8._M_elems;
  std::vector<int,_std::allocator<int>_>::vector(local_490,__l_30,&local_615);
  __l_31._M_len = 5;
  __l_31._M_array = (iterator)&gtest_ar;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(&adjacency_list_04_ground_truth,__l_31,&local_616);
  lVar1 = 0x60;
  do {
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)(&gtest_ar.success_ + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  piVar2 = &DAT_00153908;
  paVar3 = &local_598;
  for (lVar1 = 0x18; lVar1 != 0; lVar1 = lVar1 + -1) {
    paVar3->_M_elems[0] = *piVar2;
    piVar2 = piVar2 + (ulong)bVar5 * -2 + 1;
    paVar3 = (array<int,_8UL> *)((long)paVar3 + ((ulong)bVar5 * -2 + 1) * 4);
  }
  __l_32._M_len = 3;
  __l_32._M_array = &local_598;
  std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::vector
            ((vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *)&gtest_ar,
             __l_32,(allocator_type *)&adjacency_list_05_ground_truth);
  local_4d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_4d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_4d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_248 = 0x300000000;
  uStack_240 = 0x7ffffffff;
  local_258 = 0x10000000a;
  uStack_250 = 0x600000002;
  local_278._M_elems[4] = 1;
  local_278._M_elems[5] = 8;
  local_278._M_elems[6] = 1;
  local_278._M_elems[7] = 4;
  local_278._M_elems[0] = 10;
  local_278._M_elems[1] = 1;
  local_278._M_elems[2] = 1;
  local_278._M_elems[3] = 0xb;
  __l_33._M_len = 2;
  __l_33._M_array = &local_278;
  std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::vector
            ((vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *)&local_4c0,
             __l_33,(allocator_type *)&adjacency_info_05_ground_truth);
  local_288 = 0x300000000;
  uStack_280 = 0x8ffffffff;
  local_298 = 0x10000000a;
  uStack_290 = 0x600000002;
  local_2b8._M_elems[4] = 1;
  local_2b8._M_elems[5] = 8;
  local_2b8._M_elems[6] = 1;
  local_2b8._M_elems[7] = 5;
  local_2b8._M_elems[0] = 10;
  local_2b8._M_elems[1] = 1;
  local_2b8._M_elems[2] = 1;
  local_2b8._M_elems[3] = 0xb;
  __l_34._M_len = 2;
  __l_34._M_array = &local_2b8;
  std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::vector
            ((vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *)&vStack_4a8,
             __l_34,(allocator_type *)&local_615);
  piVar2 = &DAT_001539e8;
  paVar3 = &local_5f8;
  for (lVar1 = 0x18; lVar1 != 0; lVar1 = lVar1 + -1) {
    paVar3->_M_elems[0] = *piVar2;
    piVar2 = piVar2 + (ulong)bVar5 * -2 + 1;
    paVar3 = (array<int,_8UL> *)((long)paVar3 + ((ulong)bVar5 * -2 + 1) * 4);
  }
  __l_35._M_len = 3;
  __l_35._M_array = &local_5f8;
  std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::vector
            ((vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *)local_490,
             __l_35,(allocator_type *)&local_616);
  __l_36._M_len = 5;
  __l_36._M_array = (iterator)&gtest_ar;
  std::
  vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
  ::vector(&adjacency_info_04_ground_truth,__l_36,&local_614);
  lVar1 = 0x60;
  do {
    std::_Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::~_Vector_base
              ((_Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *)
               (&gtest_ar.success_ + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  local_598._M_elems[0] = 2;
  local_598._M_elems[1] = 3;
  __l_37._M_len = 2;
  __l_37._M_array = local_598._M_elems;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&gtest_ar,__l_37,
             (allocator_type *)&adjacency_info_05_ground_truth);
  local_4d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_4d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_4d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_5f8._M_elems[0] = 4;
  local_5f8._M_elems[1] = 0;
  __l_38._M_len = 2;
  __l_38._M_array = local_5f8._M_elems;
  std::vector<int,_std::allocator<int>_>::vector(&local_4c0,__l_38,&local_615);
  local_278._M_elems[0] = 4;
  local_278._M_elems[1] = 0;
  __l_39._M_len = 2;
  __l_39._M_array = local_278._M_elems;
  std::vector<int,_std::allocator<int>_>::vector(&vStack_4a8,__l_39,(allocator_type *)&local_616);
  local_2b8._M_elems[0] = 2;
  local_2b8._M_elems[1] = 3;
  __l_40._M_len = 2;
  __l_40._M_array = local_2b8._M_elems;
  std::vector<int,_std::allocator<int>_>::vector(local_490,__l_40,(allocator_type *)&local_614);
  __l_41._M_len = 5;
  __l_41._M_array = (iterator)&gtest_ar;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(&adjacency_list_05_ground_truth,__l_41,&local_613);
  lVar1 = 0x60;
  do {
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)(&gtest_ar.success_ + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  local_568 = 0xd00000000;
  uStack_560 = 0xa00000001;
  local_578 = 0x10000000c;
  uStack_570 = 0x600000002;
  local_598._M_elems[4] = 0;
  local_598._M_elems[5] = 0xd;
  local_598._M_elems[6] = 1;
  local_598._M_elems[7] = 9;
  local_598._M_elems[0] = 0xc;
  local_598._M_elems[1] = 1;
  local_598._M_elems[2] = 2;
  local_598._M_elems[3] = 6;
  __l_42._M_len = 2;
  __l_42._M_array = &local_598;
  std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::vector
            ((vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *)&gtest_ar,
             __l_42,(allocator_type *)&local_615);
  local_4d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_4d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_4d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_5c8 = 0xc00000000;
  uStack_5c0 = 0x900000001;
  local_5d8 = 0x10000000d;
  uStack_5d0 = 0x600000001;
  local_5f8._M_elems[4] = 1;
  local_5f8._M_elems[5] = 3;
  local_5f8._M_elems[6] = -2;
  local_5f8._M_elems[7] = 7;
  local_5f8._M_elems[0] = 0xd;
  local_5f8._M_elems[1] = 1;
  local_5f8._M_elems[2] = 2;
  local_5f8._M_elems[3] = 0xb;
  __l_43._M_len = 2;
  __l_43._M_array = &local_5f8;
  std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::vector
            ((vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *)&local_4c0,
             __l_43,(allocator_type *)&local_616);
  local_248 = 0xc00000000;
  uStack_240 = 0xa00000001;
  local_258 = 0x10000000d;
  uStack_250 = 0x600000001;
  local_278._M_elems[4] = 1;
  local_278._M_elems[5] = 3;
  local_278._M_elems[6] = -2;
  local_278._M_elems[7] = 8;
  local_278._M_elems[0] = 0xd;
  local_278._M_elems[1] = 1;
  local_278._M_elems[2] = 2;
  local_278._M_elems[3] = 0xb;
  __l_44._M_len = 2;
  __l_44._M_array = &local_278;
  std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::vector
            ((vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *)&vStack_4a8,
             __l_44,(allocator_type *)&local_614);
  local_288 = 0xd00000001;
  uStack_280 = 0x800000001;
  local_298 = 0xfffffffe00000003;
  uStack_290 = 0xb00000001;
  local_2b8._M_elems[4] = 1;
  local_2b8._M_elems[5] = 0xd;
  local_2b8._M_elems[6] = 1;
  local_2b8._M_elems[7] = 7;
  local_2b8._M_elems[0] = 3;
  local_2b8._M_elems[1] = -2;
  local_2b8._M_elems[2] = 1;
  local_2b8._M_elems[3] = 0xb;
  __l_45._M_len = 2;
  __l_45._M_array = &local_2b8;
  std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::vector
            ((vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *)local_490,
             __l_45,(allocator_type *)&local_613);
  __l_46._M_len = 5;
  __l_46._M_array = (iterator)&gtest_ar;
  std::
  vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
  ::vector(&adjacency_info_05_ground_truth,__l_46,&local_612);
  lVar1 = 0x60;
  do {
    std::_Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::~_Vector_base
              ((_Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *)
               (&gtest_ar.success_ + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  testing::internal::
  CmpHelperEQ<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>,std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>
            ((internal *)&gtest_ar,"adjacency_lists[0].adjacencyList",
             "adjacency_list_01_ground_truth",
             &(adjacency_lists.
               super__Vector_base<dgrminer::AdjacencyListCrate,_std::allocator<dgrminer::AdjacencyListCrate>_>
               ._M_impl.super__Vector_impl_data._M_start)->adjacencyList,
             &adjacency_list_01_ground_truth);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_598);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_5f8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/karelvaculik[P]dgrminer/test/unit/test_partial_union.cpp"
               ,0x6d,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_5f8,(Message *)&local_598);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    testing::internal::
    CmpHelperEQ<std::vector<std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>,std::allocator<std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>>>,std::vector<std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>,std::allocator<std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>>>>
              ((internal *)&gtest_ar,"adjacency_lists[0].adjacencyEdgeInfo",
               "adjacency_info_01_ground_truth",
               &(adjacency_lists.
                 super__Vector_base<dgrminer::AdjacencyListCrate,_std::allocator<dgrminer::AdjacencyListCrate>_>
                 ._M_impl.super__Vector_impl_data._M_start)->adjacencyEdgeInfo,
               &adjacency_info_01_ground_truth);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_598);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_5f8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/karelvaculik[P]dgrminer/test/unit/test_partial_union.cpp"
                 ,0x6e,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_5f8,(Message *)&local_598);
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      testing::internal::
      CmpHelperEQ<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>,std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>
                ((internal *)&gtest_ar,"adjacency_lists[1].adjacencyList",
                 "adjacency_list_02_ground_truth",
                 &adjacency_lists.
                  super__Vector_base<dgrminer::AdjacencyListCrate,_std::allocator<dgrminer::AdjacencyListCrate>_>
                  ._M_impl.super__Vector_impl_data._M_start[1].adjacencyList,
                 &adjacency_list_02_ground_truth);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&local_598);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_5f8,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/karelvaculik[P]dgrminer/test/unit/test_partial_union.cpp"
                   ,0x6f,pcVar4);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_5f8,(Message *)&local_598)
        ;
      }
      else {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar.message_);
        testing::internal::
        CmpHelperEQ<std::vector<std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>,std::allocator<std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>>>,std::vector<std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>,std::allocator<std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>>>>
                  ((internal *)&gtest_ar,"adjacency_lists[1].adjacencyEdgeInfo",
                   "adjacency_info_02_ground_truth",
                   &adjacency_lists.
                    super__Vector_base<dgrminer::AdjacencyListCrate,_std::allocator<dgrminer::AdjacencyListCrate>_>
                    ._M_impl.super__Vector_impl_data._M_start[1].adjacencyEdgeInfo,
                   &adjacency_info_02_ground_truth);
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&local_598);
          if (gtest_ar.message_.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar4 = "";
          }
          else {
            pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_5f8,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/karelvaculik[P]dgrminer/test/unit/test_partial_union.cpp"
                     ,0x70,pcVar4);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&local_5f8,(Message *)&local_598);
        }
        else {
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr(&gtest_ar.message_);
          testing::internal::
          CmpHelperEQ<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>,std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>
                    ((internal *)&gtest_ar,"adjacency_lists[2].adjacencyList",
                     "adjacency_list_03_ground_truth",
                     &adjacency_lists.
                      super__Vector_base<dgrminer::AdjacencyListCrate,_std::allocator<dgrminer::AdjacencyListCrate>_>
                      ._M_impl.super__Vector_impl_data._M_start[2].adjacencyList,
                     &adjacency_list_03_ground_truth);
          if (gtest_ar.success_ == false) {
            testing::Message::Message((Message *)&local_598);
            if (gtest_ar.message_.ptr_ ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar4 = "";
            }
            else {
              pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_5f8,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/karelvaculik[P]dgrminer/test/unit/test_partial_union.cpp"
                       ,0x71,pcVar4);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_5f8,(Message *)&local_598);
          }
          else {
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~scoped_ptr(&gtest_ar.message_);
            testing::internal::
            CmpHelperEQ<std::vector<std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>,std::allocator<std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>>>,std::vector<std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>,std::allocator<std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>>>>
                      ((internal *)&gtest_ar,"adjacency_lists[2].adjacencyEdgeInfo",
                       "adjacency_info_03_ground_truth",
                       &adjacency_lists.
                        super__Vector_base<dgrminer::AdjacencyListCrate,_std::allocator<dgrminer::AdjacencyListCrate>_>
                        ._M_impl.super__Vector_impl_data._M_start[2].adjacencyEdgeInfo,
                       &adjacency_info_03_ground_truth);
            if (gtest_ar.success_ == false) {
              testing::Message::Message((Message *)&local_598);
              if (gtest_ar.message_.ptr_ ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar4 = "";
              }
              else {
                pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_5f8,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/karelvaculik[P]dgrminer/test/unit/test_partial_union.cpp"
                         ,0x72,pcVar4);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_5f8,(Message *)&local_598);
            }
            else {
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~scoped_ptr(&gtest_ar.message_);
              testing::internal::
              CmpHelperEQ<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>,std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>
                        ((internal *)&gtest_ar,"adjacency_lists[3].adjacencyList",
                         "adjacency_list_04_ground_truth",
                         &adjacency_lists.
                          super__Vector_base<dgrminer::AdjacencyListCrate,_std::allocator<dgrminer::AdjacencyListCrate>_>
                          ._M_impl.super__Vector_impl_data._M_start[3].adjacencyList,
                         &adjacency_list_04_ground_truth);
              if (gtest_ar.success_ == false) {
                testing::Message::Message((Message *)&local_598);
                if (gtest_ar.message_.ptr_ ==
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  pcVar4 = "";
                }
                else {
                  pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
                }
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&local_5f8,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/karelvaculik[P]dgrminer/test/unit/test_partial_union.cpp"
                           ,0x73,pcVar4);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&local_5f8,(Message *)&local_598);
              }
              else {
                testing::internal::
                scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::~scoped_ptr(&gtest_ar.message_);
                testing::internal::
                CmpHelperEQ<std::vector<std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>,std::allocator<std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>>>,std::vector<std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>,std::allocator<std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>>>>
                          ((internal *)&gtest_ar,"adjacency_lists[3].adjacencyEdgeInfo",
                           "adjacency_info_04_ground_truth",
                           &adjacency_lists.
                            super__Vector_base<dgrminer::AdjacencyListCrate,_std::allocator<dgrminer::AdjacencyListCrate>_>
                            ._M_impl.super__Vector_impl_data._M_start[3].adjacencyEdgeInfo,
                           &adjacency_info_04_ground_truth);
                if (gtest_ar.success_ == false) {
                  testing::Message::Message((Message *)&local_598);
                  if (gtest_ar.message_.ptr_ ==
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    pcVar4 = "";
                  }
                  else {
                    pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
                  }
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&local_5f8,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/karelvaculik[P]dgrminer/test/unit/test_partial_union.cpp"
                             ,0x74,pcVar4);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&local_5f8,(Message *)&local_598);
                }
                else {
                  testing::internal::
                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::~scoped_ptr(&gtest_ar.message_);
                  testing::internal::
                  CmpHelperEQ<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>,std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>
                            ((internal *)&gtest_ar,"adjacency_lists[4].adjacencyList",
                             "adjacency_list_05_ground_truth",
                             &adjacency_lists.
                              super__Vector_base<dgrminer::AdjacencyListCrate,_std::allocator<dgrminer::AdjacencyListCrate>_>
                              ._M_impl.super__Vector_impl_data._M_start[4].adjacencyList,
                             &adjacency_list_05_ground_truth);
                  if (gtest_ar.success_ != false) {
                    testing::internal::
                    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::~scoped_ptr(&gtest_ar.message_);
                    testing::internal::
                    CmpHelperEQ<std::vector<std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>,std::allocator<std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>>>,std::vector<std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>,std::allocator<std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>>>>
                              ((internal *)&gtest_ar,"adjacency_lists[4].adjacencyEdgeInfo",
                               "adjacency_info_05_ground_truth",
                               &adjacency_lists.
                                super__Vector_base<dgrminer::AdjacencyListCrate,_std::allocator<dgrminer::AdjacencyListCrate>_>
                                ._M_impl.super__Vector_impl_data._M_start[4].adjacencyEdgeInfo,
                               &adjacency_info_05_ground_truth);
                    if (gtest_ar.success_ == false) {
                      testing::Message::Message((Message *)&local_598);
                      if (gtest_ar.message_.ptr_ ==
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
                      {
                        pcVar4 = "";
                      }
                      else {
                        pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
                      }
                      testing::internal::AssertHelper::AssertHelper
                                ((AssertHelper *)&local_5f8,kFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/karelvaculik[P]dgrminer/test/unit/test_partial_union.cpp"
                                 ,0x76,pcVar4);
                      testing::internal::AssertHelper::operator=
                                ((AssertHelper *)&local_5f8,(Message *)&local_598);
                      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_5f8);
                      testing::internal::
                      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     *)&local_598);
                    }
                    goto LAB_0011c44e;
                  }
                  testing::Message::Message((Message *)&local_598);
                  if (gtest_ar.message_.ptr_ ==
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    pcVar4 = "";
                  }
                  else {
                    pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
                  }
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&local_5f8,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/karelvaculik[P]dgrminer/test/unit/test_partial_union.cpp"
                             ,0x75,pcVar4);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&local_5f8,(Message *)&local_598);
                }
              }
            }
          }
        }
      }
    }
  }
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_5f8);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_598);
LAB_0011c44e:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::
  vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
  ::~vector(&adjacency_info_05_ground_truth);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&adjacency_list_05_ground_truth);
  std::
  vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
  ::~vector(&adjacency_info_04_ground_truth);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&adjacency_list_04_ground_truth);
  std::
  vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
  ::~vector(&adjacency_info_03_ground_truth);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&adjacency_list_03_ground_truth);
  std::
  vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
  ::~vector(&adjacency_info_02_ground_truth);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&adjacency_list_02_ground_truth);
  std::
  vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
  ::~vector(&adjacency_info_01_ground_truth);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&adjacency_list_01_ground_truth);
  std::vector<dgrminer::AdjacencyListCrate,_std::allocator<dgrminer::AdjacencyListCrate>_>::~vector
            (&adjacency_lists);
  std::
  _Rb_tree<dgrminer::labeled_edge_with_occurrences,_dgrminer::labeled_edge_with_occurrences,_std::_Identity<dgrminer::labeled_edge_with_occurrences>,_std::less<dgrminer::labeled_edge_with_occurrences>,_std::allocator<dgrminer::labeled_edge_with_occurrences>_>
  ::~_Rb_tree(&edges_set._M_t);
  std::_Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::~_Vector_base
            (&newedges.
              super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>);
  std::
  _Rb_tree<dgrminer::labeled_node_time,_dgrminer::labeled_node_time,_std::_Identity<dgrminer::labeled_node_time>,_std::less<dgrminer::labeled_node_time>,_std::allocator<dgrminer::labeled_node_time>_>
  ::~_Rb_tree(&labeled_nodes._M_t);
  std::__cxx11::string::~string((string *)&input_file);
  dgrminer::PartialUnion::~PartialUnion(&pu);
  return;
}

Assistant:

TEST(PartialUnion, create_adjacency_lists) {
    // assumes working file reader

    FileReader fr;
    PartialUnion pu;
    bool search_for_anomalies = false;
    int window_size = 10;
    std::string input_file = "data/intro_example";

    pu = fr.read_dynamic_graph_from_file(input_file, window_size, search_for_anomalies);

    std::set<labeled_node_time> labeled_nodes = pu.compute_labeled_nodes();
    int snapshots = pu.getNumberOfSnapshots();
    std::vector<std::array<int, 8>> newedges;
    std::set<labeled_edge_with_occurrences> edges_set;
    pu.compute_labeled_edges(newedges, edges_set, labeled_nodes, false);
    std::vector<AdjacencyListCrate> adjacency_lists = pu.createAdjacencyLists(newedges, snapshots);

//    for (int i = 0; i < adjacency_lists.size(); ++i) {
//        println("LIST: ");
//        println(adjacency_lists[i].adjacencyList);
//        println(adjacency_lists[i].adjacencyEdgeInfo);
//    }
//
//    for (int j = 0; j < 14; ++j) {
//        println("LABEL: ", j, " ", pu.getEncodingLabel(j));
//    }

    std::vector<std::vector<int>> adjacency_list_01_ground_truth = {{1},
                                                                    {0},
                                                                    {},
                                                                    {}};
    std::vector<std::vector<std::array<int, ADJ_INFO___SIZE>>> adjacency_info_01_ground_truth = {
            {{2, 0, 1, 6, 0, 4, 0, 1}}, // added nodes with edges (all changetimes = 0)
            {{4, 0, 2, 6, 0, 2, 0, 1}},
            {},
            {}
    };
    std::vector<std::vector<int>> adjacency_list_02_ground_truth = {{1},
                                                                    {0, 2, 3},
                                                                    {1},
                                                                    {1}};
    std::vector<std::vector<std::array<int, ADJ_INFO___SIZE>>> adjacency_info_02_ground_truth = {
            {{8,  1,  1, 11, 1, 3, -1, 1}}, // label change of node with 0 (label 2->8, i.e. +C -> C=>D, changetime 1), label of 1 stays (4 -> 3, i.e. +A -> A, changetime - 1)
            {{3,  -1, 2, 11, 1, 8, 1,  1}, {3, -1, 1, 6, 0, 10, 1, 2}, {3, -1, 1, 6, 0, 10, 1, 3}},
            {{10, 1,  2, 6,  0, 3, -1, 2}},
            {{10, 1,  2, 6,  0, 3, -1, 3}}
    };
    std::vector<std::vector<int>> adjacency_list_03_ground_truth = {{2, 3, 4},
                                                                    {2, 3},
                                                                    {1, 0},
                                                                    {1, 0},
                                                                    {0}};
    std::vector<std::vector<std::array<int, ADJ_INFO___SIZE>>> adjacency_info_03_ground_truth = {
            {{12, 1,  2, 6,  0, 13, 1,  4}, {12, 1,  2, 6,  0, 13, 1, 5}, {12, 1, 1, 6, 0, 4, 0, 6}},
            {{3,  -2, 1, 11, 1, 13, 1,  2}, {3,  -2, 1, 11, 1, 13, 1, 3}},
            {{13, 1,  2, 11, 1, 3,  -2, 2}, {13, 1,  1, 6,  0, 12, 1, 4}},
            {{13, 1,  2, 11, 1, 3,  -2, 3}, {13, 1,  1, 6,  0, 12, 1, 5}},
            {{4,  0,  2, 6,  0, 12, 1,  6}}

    };
    std::vector<std::vector<int>> adjacency_list_04_ground_truth = {{2, 3, 4},
                                                                    {},
                                                                    {0, 4},
                                                                    {0, 4},
                                                                    {0, 2, 3}};
    std::vector<std::vector<std::array<int, ADJ_INFO___SIZE>>> adjacency_info_04_ground_truth = {
            {{8,  1,  2, 11, 1, 10, 1, 4}, {8,  1,  2, 11, 1, 10, 1,  5}, {8, 1,  1, 11, 1, 3,  -1, 6}},
            {},
            {{10, 1,  1, 11, 1, 8,  1, 4}, {10, 1,  2, 6,  0, 3,  -1, 7}},
            {{10, 1,  1, 11, 1, 8,  1, 5}, {10, 1,  2, 6,  0, 3,  -1, 8}},
            {{3,  -1, 2, 11, 1, 8,  1, 6}, {3,  -1, 1, 6,  0, 10, 1,  7}, {3, -1, 1, 6,  0, 10, 1,  8}}

    };
    std::vector<std::vector<int>> adjacency_list_05_ground_truth = {{2, 3},
                                                                    {},
                                                                    {4, 0},
                                                                    {4, 0},
                                                                    {2, 3}};
    std::vector<std::vector<std::array<int, ADJ_INFO___SIZE>>> adjacency_info_05_ground_truth = {
            {{12, 1,  2, 6,  0, 13, 1,  9}, {12, 1,  2, 6,  0, 13, 1, 10}},
            {},
            {{13, 1,  2, 11, 1, 3,  -2, 7}, {13, 1,  1, 6,  0, 12, 1, 9}},
            {{13, 1,  2, 11, 1, 3,  -2, 8}, {13, 1,  1, 6,  0, 12, 1, 10}},
            {{3,  -2, 1, 11, 1, 13, 1,  7}, {3,  -2, 1, 11, 1, 13, 1, 8}}
    };

    ASSERT_EQ(adjacency_lists[0].adjacencyList, adjacency_list_01_ground_truth);
    ASSERT_EQ(adjacency_lists[0].adjacencyEdgeInfo, adjacency_info_01_ground_truth);
    ASSERT_EQ(adjacency_lists[1].adjacencyList, adjacency_list_02_ground_truth);
    ASSERT_EQ(adjacency_lists[1].adjacencyEdgeInfo, adjacency_info_02_ground_truth);
    ASSERT_EQ(adjacency_lists[2].adjacencyList, adjacency_list_03_ground_truth);
    ASSERT_EQ(adjacency_lists[2].adjacencyEdgeInfo, adjacency_info_03_ground_truth);
    ASSERT_EQ(adjacency_lists[3].adjacencyList, adjacency_list_04_ground_truth);
    ASSERT_EQ(adjacency_lists[3].adjacencyEdgeInfo, adjacency_info_04_ground_truth);
    ASSERT_EQ(adjacency_lists[4].adjacencyList, adjacency_list_05_ground_truth);
    ASSERT_EQ(adjacency_lists[4].adjacencyEdgeInfo, adjacency_info_05_ground_truth);

}